

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

char * cppcms_capi_session_get_session_cookie_name(cppcms_capi_session *session)

{
  long in_RDI;
  string local_40 [8];
  session_interface *in_stack_ffffffffffffffc8;
  cppcms_capi_session *in_stack_ffffffffffffffd0;
  char *local_8;
  
  if (in_RDI == 0) {
    local_8 = (char *)0x0;
  }
  else {
    cppcms_capi_session::check(in_stack_ffffffffffffffd0);
    booster::hold_ptr<cppcms::session_interface>::operator->
              ((hold_ptr<cppcms::session_interface> *)(in_RDI + 0x78));
    cppcms::session_interface::session_cookie_name_abi_cxx11_(in_stack_ffffffffffffffc8);
    std::__cxx11::string::operator=((string *)(in_RDI + 0xb8),local_40);
    std::__cxx11::string::~string(local_40);
    local_8 = (char *)std::__cxx11::string::c_str();
  }
  return local_8;
}

Assistant:

char const *cppcms_capi_session_get_session_cookie_name(cppcms_capi_session *session)
{
	TRY {
		if(!session)
			return 0;
		session->check();
		session->returned_value = session->p->session_cookie_name();
		return session->returned_value.c_str();
	}